

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildValueNumberTable(IRContext *this)

{
  Analysis AVar1;
  IRContext *local_20;
  unique_ptr<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_20 = this;
  local_10 = this;
  MakeUnique<spvtools::opt::ValueNumberTable,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&local_20);
  std::
  unique_ptr<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  ::operator=(&this->vn_table_,&local_18);
  std::
  unique_ptr<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
  ::~unique_ptr(&local_18);
  AVar1 = operator|(this->valid_analyses_,kAnalysisValueNumberTable);
  this->valid_analyses_ = AVar1;
  return;
}

Assistant:

void BuildValueNumberTable() {
    vn_table_ = MakeUnique<ValueNumberTable>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisValueNumberTable;
  }